

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-twoparty-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase100::run(TestCase100 *this)

{
  Builder builder;
  bool bVar1;
  RefOrVoid<kj::AsyncIoProvider> ioProvider;
  RefOrVoid<kj::AsyncIoStream> stream;
  size_t __n;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  Reader RVar2;
  ReaderOptions receiveOptions;
  undefined6 in_stack_fffffffffffffad0;
  undefined1 in_stack_fffffffffffffad6;
  undefined1 in_stack_fffffffffffffad7;
  bool local_4e1;
  int local_4e0;
  bool _kj_shouldLog_3;
  undefined1 local_4d8 [7];
  bool _kj_shouldLog_2;
  Response<capnproto_test::capnp::test::TestInterface::BazResults> response2;
  bool local_481;
  undefined1 auStack_480 [7];
  bool _kj_shouldLog_1;
  size_t local_478;
  undefined1 local_470 [8];
  Response<capnproto_test::capnp::test::TestInterface::FooResults> response1;
  bool _kj_shouldLog;
  undefined1 local_419 [57];
  undefined1 local_3e0 [8];
  PromiseForResult<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_rpc_twoparty_test_c__:126:7),_capnp::Response<capnproto_test::capnp::test::TestInterface::BarResults>_>
  promise3;
  undefined1 local_3b8 [8];
  Request<capnproto_test::capnp::test::TestInterface::BarParams,_capnproto_test::capnp::test::TestInterface::BarResults>
  request3;
  undefined1 local_378 [7];
  bool barFailed;
  RemotePromise<capnproto_test::capnp::test::TestInterface::BazResults> promise2;
  undefined8 uStack_338;
  undefined8 local_330;
  undefined8 uStack_328;
  size_t local_320;
  Maybe<capnp::MessageSize> local_318;
  undefined1 local_300 [8];
  Request<capnproto_test::capnp::test::TestInterface::BazParams,_capnproto_test::capnp::test::TestInterface::BazResults>
  request2;
  RemotePromise<capnproto_test::capnp::test::TestInterface::FooResults> promise1;
  undefined1 local_278 [8];
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  request1;
  undefined1 local_230 [8];
  Client client;
  RpcSystem<capnp::rpc::twoparty::VatId> rpcClient;
  int iStack_200;
  undefined1 local_1f8 [8];
  TwoPartyVatNetwork network;
  undefined1 local_68 [8];
  PipeThread serverThread;
  int handleCount;
  int callCount;
  AsyncIoContext ioContext;
  TestCase100 *this_local;
  
  ioContext.unixEventPort = (UnixEventPort *)this;
  kj::setupAsyncIo();
  serverThread.pipe.ptr._4_4_ = 0;
  serverThread.pipe.ptr._0_4_ = 0;
  ioProvider = kj::Own<kj::AsyncIoProvider>::operator*
                         ((Own<kj::AsyncIoProvider> *)&ioContext.lowLevelProvider.ptr);
  runServer((PipeThread *)local_68,ioProvider,(int *)((long)&serverThread.pipe.ptr + 4),
            (int *)&serverThread.pipe.ptr);
  stream = kj::Own<kj::AsyncIoStream>::operator*((Own<kj::AsyncIoStream> *)&serverThread.thread.ptr)
  ;
  rpcClient.super_RpcSystemBase.impl.ptr = (Impl *)0x0;
  iStack_200 = 0;
  ReaderOptions::ReaderOptions((ReaderOptions *)&rpcClient.super_RpcSystemBase.impl.ptr);
  receiveOptions._8_8_ = 0;
  receiveOptions.traversalLimitInWords = (uint64_t)rpcClient.super_RpcSystemBase.impl.ptr;
  TwoPartyVatNetwork::TwoPartyVatNetwork
            ((TwoPartyVatNetwork *)local_1f8,stream,CLIENT,receiveOptions);
  makeRpcClient<capnp::rpc::twoparty::VatId,capnp::rpc::twoparty::ProvisionId,capnp::rpc::twoparty::RecipientId,capnp::rpc::twoparty::ThirdPartyCapId,capnp::rpc::twoparty::JoinResult>
            ((capnp *)&client.field_0x10,
             (VatNetwork<capnp::rpc::twoparty::VatId,_capnp::rpc::twoparty::ProvisionId,_capnp::rpc::twoparty::RecipientId,_capnp::rpc::twoparty::ThirdPartyCapId,_capnp::rpc::twoparty::JoinResult>
              *)local_1f8);
  __n = 0;
  getPersistentCap((anon_unknown_0 *)&request1.hook.ptr,
                   (RpcSystem<capnp::rpc::twoparty::VatId> *)&client.field_0x10,SERVER,
                   TEST_INTERFACE);
  Capability::Client::castAs<capnproto_test::capnp::test::TestInterface>
            ((Client *)local_230,(Client *)&request1.hook.ptr);
  Capability::Client::~Client((Client *)&request1.hook.ptr);
  kj::Maybe<capnp::MessageSize>::Maybe
            ((Maybe<capnp::MessageSize> *)&promise1.super_Pipeline._typeless.ops.disposer,
             (void *)0x0);
  capnproto_test::capnp::test::TestInterface::Client::fooRequest
            ((Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
              *)local_278,(Client *)local_230,
             (Maybe<capnp::MessageSize> *)&promise1.super_Pipeline._typeless.ops.disposer);
  kj::Maybe<capnp::MessageSize>::~Maybe
            ((Maybe<capnp::MessageSize> *)&promise1.super_Pipeline._typeless.ops.disposer);
  capnproto_test::capnp::test::TestInterface::FooParams::Builder::setI((Builder *)local_278,0x7b);
  capnproto_test::capnp::test::TestInterface::FooParams::Builder::setJ((Builder *)local_278,true);
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  ::send((Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
          *)&request2.hook.ptr,(int)local_278,__buf,__n,iStack_200);
  kj::Maybe<capnp::MessageSize>::Maybe(&local_318,(void *)0x0);
  capnproto_test::capnp::test::TestInterface::Client::bazRequest
            ((Request<capnproto_test::capnp::test::TestInterface::BazParams,_capnproto_test::capnp::test::TestInterface::BazResults>
              *)local_300,(Client *)local_230,&local_318);
  kj::Maybe<capnp::MessageSize>::~Maybe(&local_318);
  capnproto_test::capnp::test::TestInterface::BazParams::Builder::initS
            ((Builder *)&promise2.super_Pipeline._typeless.ops.disposer,(Builder *)local_300);
  builder._builder.capTable = (CapTableBuilder *)local_330;
  builder._builder.segment = (SegmentBuilder *)uStack_338;
  builder._builder.data = (void *)uStack_328;
  builder._builder.pointers = (WirePointer *)local_320;
  builder._builder.dataSize = (int)in_stack_fffffffffffffad0;
  builder._builder.pointerCount = (short)((uint6)in_stack_fffffffffffffad0 >> 0x20);
  builder._builder._38_1_ = in_stack_fffffffffffffad6;
  builder._builder._39_1_ = in_stack_fffffffffffffad7;
  initTestMessage(builder);
  Request<capnproto_test::capnp::test::TestInterface::BazParams,_capnproto_test::capnp::test::TestInterface::BazResults>
  ::send((Request<capnproto_test::capnp::test::TestInterface::BazParams,_capnproto_test::capnp::test::TestInterface::BazResults>
          *)local_378,(int)local_300,__buf_00,local_320,iStack_200);
  request3.hook.ptr._7_1_ = 0;
  kj::Maybe<capnp::MessageSize>::Maybe
            ((Maybe<capnp::MessageSize> *)&promise3.super_PromiseBase.node.ptr,(void *)0x0);
  capnproto_test::capnp::test::TestInterface::Client::barRequest
            ((Request<capnproto_test::capnp::test::TestInterface::BarParams,_capnproto_test::capnp::test::TestInterface::BarResults>
              *)local_3b8,(Client *)local_230,
             (Maybe<capnp::MessageSize> *)&promise3.super_PromiseBase.node.ptr);
  kj::Maybe<capnp::MessageSize>::~Maybe
            ((Maybe<capnp::MessageSize> *)&promise3.super_PromiseBase.node.ptr);
  Request<capnproto_test::capnp::test::TestInterface::BarParams,_capnproto_test::capnp::test::TestInterface::BarResults>
  ::send((Request<capnproto_test::capnp::test::TestInterface::BarParams,_capnproto_test::capnp::test::TestInterface::BarResults>
          *)(local_419 + 1),(int)local_3b8,__buf_01,local_320,iStack_200);
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestInterface::BarResults>>::
  then<capnp::_::(anonymous_namespace)::TestCase100::run()::__0,capnp::_::(anonymous_namespace)::TestCase100::run()::__1>
            ((Promise<capnp::Response<capnproto_test::capnp::test::TestInterface::BarResults>> *)
             local_3e0,(Type *)(local_419 + 1),(Type *)local_419);
  RemotePromise<capnproto_test::capnp::test::TestInterface::BarResults>::~RemotePromise
            ((RemotePromise<capnproto_test::capnp::test::TestInterface::BarResults> *)
             (local_419 + 1));
  if (serverThread.pipe.ptr._4_4_ != 0) {
    response1.hook.ptr._7_1_ = kj::_::Debug::shouldLog(ERROR);
    while ((bool)response1.hook.ptr._7_1_ != false) {
      response1.hook.ptr._0_4_ = 0;
      kj::_::Debug::log<char_const(&)[36],int,int&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-twoparty-test.c++"
                 ,0x84,ERROR,"\"failed: expected \" \"(0) == (callCount)\", 0, callCount",
                 (char (*) [36])"failed: expected (0) == (callCount)",(int *)&response1.hook.ptr,
                 (int *)((long)&serverThread.pipe.ptr + 4));
      response1.hook.ptr._7_1_ = false;
    }
  }
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>_>::wait
            ((Promise<capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>_> *)
             local_470,&request2.hook.ptr);
  _auStack_480 = (ArrayPtr<const_char>)
                 capnproto_test::capnp::test::TestInterface::FooResults::Reader::getX
                           ((Reader *)local_470);
  bVar1 = kj::operator==("foo",(StringPtr *)auStack_480);
  if (!bVar1) {
    local_481 = kj::_::Debug::shouldLog(ERROR);
    while (local_481 != false) {
      RVar2 = capnproto_test::capnp::test::TestInterface::FooResults::Reader::getX
                        ((Reader *)local_470);
      response2.hook.ptr = RVar2.super_StringPtr.content.ptr;
      kj::_::Debug::log<char_const(&)[47],char_const(&)[4],capnp::Text::Reader>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-twoparty-test.c++"
                 ,0x88,ERROR,
                 "\"failed: expected \" \"(\\\"foo\\\") == (response1.getX())\", \"foo\", response1.getX()"
                 ,(char (*) [47])"failed: expected (\"foo\") == (response1.getX())",
                 (char (*) [4])0xa4c8db,(Reader *)&response2.hook.ptr);
      local_481 = false;
    }
  }
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestInterface::BazResults>_>::wait
            ((Promise<capnp::Response<capnproto_test::capnp::test::TestInterface::BazResults>_> *)
             local_4d8,local_378);
  kj::Promise<void>::wait((Promise<void> *)local_3e0,ioContext.provider.ptr);
  if (serverThread.pipe.ptr._4_4_ != 2) {
    _kj_shouldLog_3 = kj::_::Debug::shouldLog(ERROR);
    while (_kj_shouldLog_3 != false) {
      local_4e0 = 2;
      kj::_::Debug::log<char_const(&)[36],int,int&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-twoparty-test.c++"
                 ,0x8e,ERROR,"\"failed: expected \" \"(2) == (callCount)\", 2, callCount",
                 (char (*) [36])"failed: expected (2) == (callCount)",&local_4e0,
                 (int *)((long)&serverThread.pipe.ptr + 4));
      _kj_shouldLog_3 = false;
    }
  }
  if ((request3.hook.ptr._7_1_ & 1) == 0) {
    local_4e1 = kj::_::Debug::shouldLog(ERROR);
    while (local_4e1 != false) {
      kj::_::Debug::log<char_const(&)[27]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-twoparty-test.c++"
                 ,0x8f,ERROR,"\"failed: expected \" \"barFailed\"",
                 (char (*) [27])"failed: expected barFailed");
      local_4e1 = false;
    }
  }
  Response<capnproto_test::capnp::test::TestInterface::BazResults>::~Response
            ((Response<capnproto_test::capnp::test::TestInterface::BazResults> *)local_4d8);
  Response<capnproto_test::capnp::test::TestInterface::FooResults>::~Response
            ((Response<capnproto_test::capnp::test::TestInterface::FooResults> *)local_470);
  kj::Promise<void>::~Promise((Promise<void> *)local_3e0);
  Request<capnproto_test::capnp::test::TestInterface::BarParams,_capnproto_test::capnp::test::TestInterface::BarResults>
  ::~Request((Request<capnproto_test::capnp::test::TestInterface::BarParams,_capnproto_test::capnp::test::TestInterface::BarResults>
              *)local_3b8);
  RemotePromise<capnproto_test::capnp::test::TestInterface::BazResults>::~RemotePromise
            ((RemotePromise<capnproto_test::capnp::test::TestInterface::BazResults> *)local_378);
  Request<capnproto_test::capnp::test::TestInterface::BazParams,_capnproto_test::capnp::test::TestInterface::BazResults>
  ::~Request((Request<capnproto_test::capnp::test::TestInterface::BazParams,_capnproto_test::capnp::test::TestInterface::BazResults>
              *)local_300);
  RemotePromise<capnproto_test::capnp::test::TestInterface::FooResults>::~RemotePromise
            ((RemotePromise<capnproto_test::capnp::test::TestInterface::FooResults> *)
             &request2.hook.ptr);
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  ::~Request((Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
              *)local_278);
  capnproto_test::capnp::test::TestInterface::Client::~Client((Client *)local_230);
  RpcSystem<capnp::rpc::twoparty::VatId>::~RpcSystem
            ((RpcSystem<capnp::rpc::twoparty::VatId> *)&client.field_0x10);
  TwoPartyVatNetwork::~TwoPartyVatNetwork((TwoPartyVatNetwork *)local_1f8);
  kj::AsyncIoProvider::PipeThread::~PipeThread((PipeThread *)local_68);
  kj::AsyncIoContext::~AsyncIoContext((AsyncIoContext *)&handleCount);
  return;
}

Assistant:

TEST(TwoPartyNetwork, Basic) {
  auto ioContext = kj::setupAsyncIo();
  int callCount = 0;
  int handleCount = 0;

  auto serverThread = runServer(*ioContext.provider, callCount, handleCount);
  TwoPartyVatNetwork network(*serverThread.pipe, rpc::twoparty::Side::CLIENT);
  auto rpcClient = makeRpcClient(network);

  // Request the particular capability from the server.
  auto client = getPersistentCap(rpcClient, rpc::twoparty::Side::SERVER,
      test::TestSturdyRefObjectId::Tag::TEST_INTERFACE).castAs<test::TestInterface>();

  // Use the capability.
  auto request1 = client.fooRequest();
  request1.setI(123);
  request1.setJ(true);
  auto promise1 = request1.send();

  auto request2 = client.bazRequest();
  initTestMessage(request2.initS());
  auto promise2 = request2.send();

  bool barFailed = false;
  auto request3 = client.barRequest();
  auto promise3 = request3.send().then(
      [](Response<test::TestInterface::BarResults>&& response) {
        ADD_FAILURE() << "Expected bar() call to fail.";
      }, [&](kj::Exception&& e) {
        barFailed = true;
      });

  EXPECT_EQ(0, callCount);

  auto response1 = promise1.wait(ioContext.waitScope);

  EXPECT_EQ("foo", response1.getX());

  auto response2 = promise2.wait(ioContext.waitScope);

  promise3.wait(ioContext.waitScope);

  EXPECT_EQ(2, callCount);
  EXPECT_TRUE(barFailed);
}